

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

StatementMap * __thiscall
Js::FunctionBody::GetMatchingStatementMapFromSource
          (FunctionBody *this,int sourceOffset,int *pMapIndex)

{
  FunctionBody *this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int index;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  Type *pTVar4;
  
  this_01 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,StatementMaps);
  if ((this_01 !=
       (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     (0 < (this_01->
          super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>).
          count)) {
    if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      this = (FunctionBody *)__tls_get_addr(&PTR_0155fe48);
      *(Type *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xc5a,"(m_sourceInfo.pSpanSequence == nullptr)",
                                  "m_sourceInfo.pSpanSequence == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(Type *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
    }
    index = (this_01->
            super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>)
            .count;
    do {
      index = index + -1;
      if (index < 0) break;
      pTVar4 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,index);
      this_00 = (FunctionBody *)pTVar4->ptr;
      bVar2 = true;
      if (*(char *)&(this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          '\0') {
        bVar3 = regex::Interval::Includes((Interval *)this_00,sourceOffset);
        bVar2 = !bVar3;
        if (bVar3) {
          this = this_00;
        }
        if ((pMapIndex != (int *)0x0) && (bVar3)) {
          *pMapIndex = index;
          bVar2 = false;
          this = this_00;
        }
      }
    } while (bVar2);
    if (-1 < index) {
      return (StatementMap *)this;
    }
  }
  if (pMapIndex != (int *)0x0) {
    *pMapIndex = 0;
  }
  return (StatementMap *)0x0;
}

Assistant:

FunctionBody::StatementMap* FunctionBody::GetMatchingStatementMapFromSource(int sourceOffset, int* pMapIndex /* = nullptr */)
    {
        StatementMapList * pStatementMaps = this->GetStatementMaps();
        if (pStatementMaps && pStatementMaps->Count() > 0)
        {
            Assert(m_sourceInfo.pSpanSequence == nullptr);
            for (int index = pStatementMaps->Count() - 1; index >= 0; index--)
            {
                FunctionBody::StatementMap* pStatementMap = pStatementMaps->Item(index);

                if (!pStatementMap->isSubexpression && pStatementMap->sourceSpan.Includes(sourceOffset))
                {
                    if (pMapIndex)
                    {
                        *pMapIndex = index;
                    }
                    return pStatementMap;
                }
            }
        }

        if (pMapIndex)
        {
            *pMapIndex = 0;
        }
        return nullptr;
    }